

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O1

int Aig_ManCiCleanupBiere(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  
  iVar1 = p->nObjs[2];
  iVar2 = p->vCis->nSize;
  p->nObjs[2] = iVar2;
  if (p->nRegs != 0) {
    p->nTruePis = iVar2 - p->nRegs;
  }
  return iVar1 - iVar2;
}

Assistant:

static inline int          Aig_ManCiNum( Aig_Man_t * p )          { return p->nObjs[AIG_OBJ_CI];                     }